

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrSceneComputeFeatureMSFT value)

{
  bool bVar1;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_c1;
  string vuid;
  string error_str;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_MSFT_scene_understanding"),
     bVar1)) {
    if (value - XR_SCENE_COMPUTE_FEATURE_PLANE_MSFT < 4) {
      return true;
    }
    if (value == XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT) {
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_MSFT_scene_marker");
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT\"",
                 &local_c1);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&error_str);
      this = &local_78;
    }
    else {
      if (value != XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT) {
        return false;
      }
      if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
        return true;
      }
      bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                               "XR_MSFT_scene_understanding_serialization");
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::append((string *)&vuid);
      std::__cxx11::string::append((char *)&vuid);
      std::__cxx11::string::string
                ((string *)&error_str,
                 "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT\""
                 ,&local_c1);
      std::__cxx11::string::append((char *)&error_str);
      std::__cxx11::string::append((char *)&error_str);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,objects_info);
      CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_60,&error_str);
      this = &local_60;
    }
  }
  else {
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,"XrSceneComputeFeatureMSFT requires extension ",&local_c1);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&error_str);
    this = &local_48;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&error_str);
  std::__cxx11::string::~string((string *)&vuid);
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrSceneComputeFeatureMSFT value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_MSFT_scene_understanding, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_understanding")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrSceneComputeFeatureMSFT requires extension ";
        error_str += " \"XR_MSFT_scene_understanding\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_SCENE_COMPUTE_FEATURE_PLANE_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_PLANE_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_VISUAL_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_COLLIDER_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT:
            // Enum value XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT requires extension XR_MSFT_scene_understanding_serialization, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_understanding_serialization")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_scene_understanding_serialization\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT:
            // Enum value XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT requires extension XR_MSFT_scene_marker, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_marker")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_scene_marker\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}